

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void mct_decode_real(float *c0,float *c1,float *c2,int n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m128 vbu;
  __m128 vgv;
  __m128 vgu;
  __m128 vrv;
  int i;
  int local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float b;
  float g;
  float r;
  float v;
  float u;
  float y;
  __m128 vb;
  __m128 vg;
  __m128 vr;
  __m128 vv;
  __m128 vu;
  __m128 vy;
  
  local_380 = in_RDX;
  local_378 = in_RSI;
  local_370 = in_RDI;
  for (local_388 = 0; local_388 < (int)in_ECX >> 3; local_388 = local_388 + 1) {
    local_148 = (float)*local_380;
    fStack_144 = (float)((ulong)*local_380 >> 0x20);
    fStack_140 = (float)local_380[1];
    fStack_13c = (float)((ulong)local_380[1] >> 0x20);
    local_248 = (float)*local_370;
    fStack_244 = (float)((ulong)*local_370 >> 0x20);
    fStack_240 = (float)local_370[1];
    fStack_23c = (float)((ulong)local_370[1] >> 0x20);
    local_168 = (float)*local_378;
    fStack_164 = (float)((ulong)*local_378 >> 0x20);
    fStack_160 = (float)local_378[1];
    fStack_15c = (float)((ulong)local_378[1] >> 0x20);
    *local_370 = CONCAT44(fStack_244 + fStack_144 * 1.402,local_248 + local_148 * 1.402);
    local_370[1] = CONCAT44(fStack_23c + fStack_13c * 1.402,fStack_240 + fStack_140 * 1.402);
    *local_378 = CONCAT44((fStack_244 - fStack_164 * 0.34413) - fStack_144 * 0.71414,
                          (local_248 - local_168 * 0.34413) - local_148 * 0.71414);
    local_378[1] = CONCAT44((fStack_23c - fStack_15c * 0.34413) - fStack_13c * 0.71414,
                            (fStack_240 - fStack_160 * 0.34413) - fStack_140 * 0.71414);
    *local_380 = CONCAT44(fStack_244 + fStack_164 * 1.772,local_248 + local_168 * 1.772);
    local_380[1] = CONCAT44(fStack_23c + fStack_15c * 1.772,fStack_240 + fStack_160 * 1.772);
    uVar4 = local_370[2];
    uVar5 = local_378[2];
    uVar6 = local_380[2];
    local_1c8 = (float)uVar6;
    fStack_1c4 = (float)((ulong)uVar6 >> 0x20);
    fStack_1c0 = (float)local_380[3];
    fStack_1bc = (float)((ulong)local_380[3] >> 0x20);
    local_288 = (float)uVar4;
    fStack_284 = (float)((ulong)uVar4 >> 0x20);
    fStack_280 = (float)local_370[3];
    fStack_27c = (float)((ulong)local_370[3] >> 0x20);
    local_1e8 = (float)uVar5;
    fStack_1e4 = (float)((ulong)uVar5 >> 0x20);
    fStack_1e0 = (float)local_378[3];
    fStack_1dc = (float)((ulong)local_378[3] >> 0x20);
    local_370[2] = CONCAT44(fStack_284 + fStack_1c4 * 1.402,local_288 + local_1c8 * 1.402);
    local_370[3] = CONCAT44(fStack_27c + fStack_1bc * 1.402,fStack_280 + fStack_1c0 * 1.402);
    local_378[2] = CONCAT44((fStack_284 - fStack_1e4 * 0.34413) - fStack_1c4 * 0.71414,
                            (local_288 - local_1e8 * 0.34413) - local_1c8 * 0.71414);
    local_378[3] = CONCAT44((fStack_27c - fStack_1dc * 0.34413) - fStack_1bc * 0.71414,
                            (fStack_280 - fStack_1e0 * 0.34413) - fStack_1c0 * 0.71414);
    local_380[2] = CONCAT44(fStack_284 + fStack_1e4 * 1.772,local_288 + local_1e8 * 1.772);
    local_380[3] = CONCAT44(fStack_27c + fStack_1dc * 1.772,fStack_280 + fStack_1e0 * 1.772);
    local_370 = local_370 + 4;
    local_378 = local_378 + 4;
    local_380 = local_380 + 4;
  }
  for (local_388 = 0; local_388 < (int)(in_ECX & 7); local_388 = local_388 + 1) {
    fVar1 = *(float *)((long)local_370 + (long)local_388 * 4);
    fVar2 = *(float *)((long)local_378 + (long)local_388 * 4);
    fVar3 = *(float *)((long)local_380 + (long)local_388 * 4);
    *(float *)((long)local_370 + (long)local_388 * 4) = fVar1 + fVar3 * 1.402;
    *(float *)((long)local_378 + (long)local_388 * 4) = (fVar1 - fVar2 * 0.34413) - fVar3 * 0.71414;
    *(float *)((long)local_380 + (long)local_388 * 4) = fVar1 + fVar2 * 1.772;
  }
  return;
}

Assistant:

void mct_decode_real(
		float* restrict c0,
		float* restrict c1,
		float* restrict c2,
		int n)
{
	int i;
#ifdef __SSE__
	__m128 vrv, vgu, vgv, vbu;
	vrv = _mm_set1_ps(1.402f);
	vgu = _mm_set1_ps(0.34413f);
	vgv = _mm_set1_ps(0.71414f);
	vbu = _mm_set1_ps(1.772f);
	for (i = 0; i < (n >> 3); ++i) {
		__m128 vy, vu, vv;
		__m128 vr, vg, vb;

		vy = _mm_load_ps(c0);
		vu = _mm_load_ps(c1);
		vv = _mm_load_ps(c2);
		vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
		vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
		vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
		_mm_store_ps(c0, vr);
		_mm_store_ps(c1, vg);
		_mm_store_ps(c2, vb);
		c0 += 4;
		c1 += 4;
		c2 += 4;

		vy = _mm_load_ps(c0);
		vu = _mm_load_ps(c1);
		vv = _mm_load_ps(c2);
		vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
		vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
		vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
		_mm_store_ps(c0, vr);
		_mm_store_ps(c1, vg);
		_mm_store_ps(c2, vb);
		c0 += 4;
		c1 += 4;
		c2 += 4;
	}
	n &= 7;
#endif
	for(i = 0; i < n; ++i) {
		float y = c0[i];
		float u = c1[i];
		float v = c2[i];
		float r = y + (v * 1.402f);
		float g = y - (u * 0.34413f) - (v * (0.71414f));
		float b = y + (u * 1.772f);
		c0[i] = r;
		c1[i] = g;
		c2[i] = b;
	}
}